

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  long in_RDI;
  bool bVar2;
  ImGuiTableColumn *column_1;
  int column_n_1;
  ImGuiTableColumn *column;
  int column_n;
  float visible_width;
  float visible_weight;
  int in_stack_ffffffffffffffdc;
  int i;
  ImGuiTableColumn *in_stack_ffffffffffffffe0;
  int local_14;
  float local_10;
  float local_c;
  
  bVar2 = false;
  if (*(char *)(in_RDI + 0x23e) != -1) {
    bVar2 = *(char *)(in_RDI + 0x23f) != -1;
  }
  if (!bVar2) {
    __assert_fail("table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x832,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  local_c = 0.0;
  local_10 = 0.0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x6c); local_14 = local_14 + 1) {
    in_stack_ffffffffffffffe0 =
         ImSpan<ImGuiTableColumn>::operator[]
                   ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc)
    ;
    if (((in_stack_ffffffffffffffe0->IsEnabled & 1U) != 0) &&
       ((in_stack_ffffffffffffffe0->Flags & 4U) != 0)) {
      if (in_stack_ffffffffffffffe0->StretchWeight <= 0.0) {
        __assert_fail("column->StretchWeight > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x83c,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
      }
      local_c = in_stack_ffffffffffffffe0->StretchWeight + local_c;
      local_10 = in_stack_ffffffffffffffe0->WidthRequest + local_10;
    }
  }
  if (local_c <= 0.0 || local_10 <= 0.0) {
    __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x840,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  i = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x6c) <= i) {
      return;
    }
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffe0,i);
    if ((((pIVar1->IsEnabled & 1U) != 0) && ((pIVar1->Flags & 4U) != 0)) &&
       (pIVar1->StretchWeight = (pIVar1->WidthRequest / local_10) * local_c,
       pIVar1->StretchWeight <= 0.0)) break;
    i = i + 1;
  }
  __assert_fail("column->StretchWeight > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0x849,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}